

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,151>::
CompactCovarianceBase<njoy::ENDFtk::section::Type<32,151>::CompactBreitWignerUncertainties,double,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner>
::CompactCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (CompactCovarianceBase<njoy::ENDFtk::section::Type<32,151>::CompactBreitWignerUncertainties,double,njoy::ENDFtk::section::Type<32,151>::CompactSingleLevelBreitWigner>
           *this,double spi,double ap,long l1,long n1,optional<double> *dap,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  CompactBreitWignerUncertainties local_78;
  
  CompactBreitWignerUncertainties::
  CompactBreitWignerUncertainties<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((CompactBreitWignerUncertainties *)&local_78,it,end,lineNumber,MAT,MF,MT);
  CompactCovarianceBase<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,spi,ap,l1,n1,dap,&local_78,it,end,lineNumber,MAT,MF,MT);
  if (local_78.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

CompactCovarianceBase( double spi, double ap, long l1, long n1,
                       std::optional< RadiusUncertainty >&& dap,
                       Iterator& it, const Iterator& end, long& lineNumber,
                       int MAT, int MF, int MT ) :
  // no try ... catch: exceptions will be handled in the derived class
  CompactCovarianceBase( spi, ap, l1, n1, std::move( dap ),
                         ResonanceParameterUncertainties( it, end, lineNumber,
                                                          MAT, MF, MT ),
                         it, end, lineNumber, MAT, MF, MT ) {}